

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

UCVarValue FBaseCVar::FromBool(bool value,ECVarType type)

{
  UCVarValue ret;
  
  switch(type) {
  case CVAR_Bool:
    ret.Bool = value;
    break;
  case CVAR_Int:
    ret.Int._1_3_ = 0;
    ret.Bool = value;
    break;
  case CVAR_Float:
    ret.Float = (float)value;
    break;
  case CVAR_String:
    ret.String = falsestr;
    if (value) {
      ret.String = truestr;
    }
    break;
  case CVAR_GUID:
    ret.String = (char *)0x0;
  }
  return (UCVarValue)ret.String;
}

Assistant:

UCVarValue FBaseCVar::FromBool (bool value, ECVarType type)
{
	UCVarValue ret;

	switch (type)
	{
	case CVAR_Bool:
		ret.Bool = value;
		break;

	case CVAR_Int:
		ret.Int = value;
		break;

	case CVAR_Float:
		ret.Float = value;
		break;

	case CVAR_String:
		ret.String = value ? truestr : falsestr;
		break;

	case CVAR_GUID:
		ret.pGUID = NULL;
		break;

	default:
		break;
	}

	return ret;
}